

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

int xmlParseBalancedChunkMemoryRecover
              (xmlDocPtr doc,xmlSAXHandlerPtr sax,void *user_data,int depth,xmlChar *string,
              xmlNodePtr *lst,int recover)

{
  byte *pbVar1;
  xmlChar xVar2;
  xmlDictPtr dict;
  int size;
  xmlParserCtxtPtr ctxt;
  xmlDocPtr doc_00;
  xmlChar *pxVar3;
  xmlNodePtr cur;
  _xmlNode *p_Var4;
  int iVar5;
  xmlParserErrors error;
  _xmlSAXHandler *local_40;
  
  iVar5 = 0x59;
  if (depth < 0x29) {
    if (lst != (xmlNodePtr *)0x0) {
      *lst = (xmlNodePtr)0x0;
    }
    iVar5 = -1;
    if (string != (xmlChar *)0x0) {
      size = xmlStrlen(string);
      ctxt = xmlCreateMemoryParserCtxt((char *)string,size);
      if (ctxt != (xmlParserCtxtPtr)0x0) {
        ctxt->userData = ctxt;
        if (sax == (xmlSAXHandlerPtr)0x0) {
          local_40 = (_xmlSAXHandler *)0x0;
        }
        else {
          local_40 = ctxt->sax;
          ctxt->sax = sax;
          if (user_data != (void *)0x0) {
            ctxt->userData = user_data;
          }
        }
        doc_00 = xmlNewDoc("1.0");
        if (doc_00 == (xmlDocPtr)0x0) {
          xmlFreeParserCtxt(ctxt);
        }
        else {
          doc_00->properties = 0x40;
          if ((doc == (xmlDocPtr)0x0) || (doc->dict == (_xmlDict *)0x0)) {
            ctxt->recovery = 0;
            ctxt->loadsubset = 0;
            ctxt->linenumbers = 1;
            ctxt->replaceEntities = 0;
            ctxt->pedantic = 0;
            ctxt->keepBlanks = 1;
            ctxt->validate = 0;
            ctxt->dictNames = 0;
            pbVar1 = (byte *)((long)&ctxt->options + 1);
            *pbVar1 = *pbVar1 | 0x10;
          }
          else {
            xmlDictFree(ctxt->dict);
            dict = doc->dict;
            ctxt->dict = dict;
            xmlDictReference(dict);
            pxVar3 = xmlDictLookup(ctxt->dict,"xml",3);
            ctxt->str_xml = pxVar3;
            pxVar3 = xmlDictLookup(ctxt->dict,"xmlns",5);
            ctxt->str_xmlns = pxVar3;
            pxVar3 = xmlDictLookup(ctxt->dict,(xmlChar *)"http://www.w3.org/XML/1998/namespace",0x24
                                  );
            ctxt->str_xml_ns = pxVar3;
            ctxt->dictNames = 1;
          }
          if (doc != (xmlDocPtr)0x0) {
            doc_00->intSubset = doc->intSubset;
            doc_00->extSubset = doc->extSubset;
          }
          cur = xmlNewDocNode(doc_00,(xmlNsPtr)0x0,(xmlChar *)"pseudoroot",(xmlChar *)0x0);
          if (cur == (xmlNodePtr)0x0) {
            if (sax != (xmlSAXHandlerPtr)0x0) {
              ctxt->sax = local_40;
            }
            xmlFreeParserCtxt(ctxt);
            doc_00->intSubset = (_xmlDtd *)0x0;
            doc_00->extSubset = (_xmlDtd *)0x0;
          }
          else {
            xmlAddChild((xmlNodePtr)doc_00,cur);
            nodePush(ctxt,cur);
            ctxt->myDoc = doc_00;
            if (doc != (xmlDocPtr)0x0) {
              doc_00->children->doc = doc;
              xmlSearchNsByHref(doc,(xmlNodePtr)doc,
                                (xmlChar *)"http://www.w3.org/XML/1998/namespace");
              doc_00->oldNs = doc->oldNs;
            }
            ctxt->instate = XML_PARSER_CONTENT;
            ctxt->input_id = 2;
            ctxt->depth = depth;
            ctxt->validate = 0;
            ctxt->loadsubset = 0;
            xmlDetectSAX2(ctxt);
            if (doc == (xmlDocPtr)0x0) {
              xmlParseContent(ctxt);
            }
            else {
              p_Var4 = doc->children;
              doc->children = (_xmlNode *)0x0;
              xmlParseContent(ctxt);
              doc->children = p_Var4;
            }
            pxVar3 = ctxt->input->cur;
            xVar2 = *pxVar3;
            if (xVar2 != '\0') {
              error = XML_ERR_EXTRA_CONTENT;
              if ((xVar2 == '<') && (error = XML_ERR_NOT_WELL_BALANCED, pxVar3[1] != '/')) {
                error = XML_ERR_EXTRA_CONTENT;
              }
              xmlFatalErr(ctxt,error,(char *)0x0);
            }
            if (ctxt->node != doc_00->children) {
              xmlFatalErr(ctxt,XML_ERR_NOT_WELL_BALANCED,(char *)0x0);
            }
            iVar5 = 0;
            if (ctxt->wellFormed == 0) {
              iVar5 = ctxt->errNo + (uint)(ctxt->errNo == 0);
            }
            if ((lst != (xmlNodePtr *)0x0) && ((recover == 1 || (iVar5 == 0)))) {
              p_Var4 = doc_00->children->children;
              *lst = p_Var4;
              for (; p_Var4 != (xmlNodePtr)0x0; p_Var4 = p_Var4->next) {
                xmlSetTreeDoc(p_Var4,doc);
                p_Var4->parent = (_xmlNode *)0x0;
              }
              doc_00->children->children = (_xmlNode *)0x0;
            }
            if (sax != (xmlSAXHandlerPtr)0x0) {
              ctxt->sax = local_40;
            }
            xmlFreeParserCtxt(ctxt);
            doc_00->intSubset = (_xmlDtd *)0x0;
            doc_00->extSubset = (_xmlDtd *)0x0;
            doc_00->oldNs = (_xmlNs *)0x0;
          }
          xmlFreeDoc(doc_00);
        }
      }
    }
  }
  return iVar5;
}

Assistant:

int
xmlParseBalancedChunkMemoryRecover(xmlDocPtr doc, xmlSAXHandlerPtr sax,
     void *user_data, int depth, const xmlChar *string, xmlNodePtr *lst,
     int recover) {
    xmlParserCtxtPtr ctxt;
    xmlDocPtr newDoc;
    xmlSAXHandlerPtr oldsax = NULL;
    xmlNodePtr content, newRoot;
    int size;
    int ret = 0;

    if (depth > 40) {
	return(XML_ERR_ENTITY_LOOP);
    }


    if (lst != NULL)
        *lst = NULL;
    if (string == NULL)
        return(-1);

    size = xmlStrlen(string);

    ctxt = xmlCreateMemoryParserCtxt((char *) string, size);
    if (ctxt == NULL) return(-1);
    ctxt->userData = ctxt;
    if (sax != NULL) {
	oldsax = ctxt->sax;
        ctxt->sax = sax;
	if (user_data != NULL)
	    ctxt->userData = user_data;
    }
    newDoc = xmlNewDoc(BAD_CAST "1.0");
    if (newDoc == NULL) {
	xmlFreeParserCtxt(ctxt);
	return(-1);
    }
    newDoc->properties = XML_DOC_INTERNAL;
    if ((doc != NULL) && (doc->dict != NULL)) {
        xmlDictFree(ctxt->dict);
	ctxt->dict = doc->dict;
	xmlDictReference(ctxt->dict);
	ctxt->str_xml = xmlDictLookup(ctxt->dict, BAD_CAST "xml", 3);
	ctxt->str_xmlns = xmlDictLookup(ctxt->dict, BAD_CAST "xmlns", 5);
	ctxt->str_xml_ns = xmlDictLookup(ctxt->dict, XML_XML_NAMESPACE, 36);
	ctxt->dictNames = 1;
    } else {
	xmlCtxtUseOptionsInternal(ctxt, XML_PARSE_NODICT, NULL);
    }
    /* doc == NULL is only supported for historic reasons */
    if (doc != NULL) {
	newDoc->intSubset = doc->intSubset;
	newDoc->extSubset = doc->extSubset;
    }
    newRoot = xmlNewDocNode(newDoc, NULL, BAD_CAST "pseudoroot", NULL);
    if (newRoot == NULL) {
	if (sax != NULL)
	    ctxt->sax = oldsax;
	xmlFreeParserCtxt(ctxt);
	newDoc->intSubset = NULL;
	newDoc->extSubset = NULL;
        xmlFreeDoc(newDoc);
	return(-1);
    }
    xmlAddChild((xmlNodePtr) newDoc, newRoot);
    nodePush(ctxt, newRoot);
    /* doc == NULL is only supported for historic reasons */
    if (doc == NULL) {
	ctxt->myDoc = newDoc;
    } else {
	ctxt->myDoc = newDoc;
	newDoc->children->doc = doc;
	/* Ensure that doc has XML spec namespace */
	xmlSearchNsByHref(doc, (xmlNodePtr)doc, XML_XML_NAMESPACE);
	newDoc->oldNs = doc->oldNs;
    }
    ctxt->instate = XML_PARSER_CONTENT;
    ctxt->input_id = 2;
    ctxt->depth = depth;

    /*
     * Doing validity checking on chunk doesn't make sense
     */
    ctxt->validate = 0;
    ctxt->loadsubset = 0;
    xmlDetectSAX2(ctxt);

    if ( doc != NULL ){
        content = doc->children;
        doc->children = NULL;
        xmlParseContent(ctxt);
        doc->children = content;
    }
    else {
        xmlParseContent(ctxt);
    }
    if ((RAW == '<') && (NXT(1) == '/')) {
	xmlFatalErr(ctxt, XML_ERR_NOT_WELL_BALANCED, NULL);
    } else if (RAW != 0) {
	xmlFatalErr(ctxt, XML_ERR_EXTRA_CONTENT, NULL);
    }
    if (ctxt->node != newDoc->children) {
	xmlFatalErr(ctxt, XML_ERR_NOT_WELL_BALANCED, NULL);
    }

    if (!ctxt->wellFormed) {
        if (ctxt->errNo == 0)
	    ret = 1;
	else
	    ret = ctxt->errNo;
    } else {
      ret = 0;
    }

    if ((lst != NULL) && ((ret == 0) || (recover == 1))) {
	xmlNodePtr cur;

	/*
	 * Return the newly created nodeset after unlinking it from
	 * they pseudo parent.
	 */
	cur = newDoc->children->children;
	*lst = cur;
	while (cur != NULL) {
	    xmlSetTreeDoc(cur, doc);
	    cur->parent = NULL;
	    cur = cur->next;
	}
	newDoc->children->children = NULL;
    }

    if (sax != NULL)
	ctxt->sax = oldsax;
    xmlFreeParserCtxt(ctxt);
    newDoc->intSubset = NULL;
    newDoc->extSubset = NULL;
    /* This leaks the namespace list if doc == NULL */
    newDoc->oldNs = NULL;
    xmlFreeDoc(newDoc);

    return(ret);
}